

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O2

int __thiscall loader::context_t::init(context_t *this,EVP_PKEY_CTX *ctx)

{
  driver_vector_t *__result;
  driver_vector_t *this_00;
  Logger *pLVar1;
  driver_t *__first;
  driver_t *__last;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  code *pcVar5;
  ostream *poVar6;
  long lVar7;
  element_type *peVar8;
  pointer pbVar9;
  format_string_t<int,_int,_int,_const_char_(&)[41]> fmt;
  allocator local_4b1;
  shared_ptr<loader::Logger> *local_4b0;
  string message;
  string tracingLayerLibraryPath;
  string loadLibraryErrorValue;
  string local_418;
  link_map *dlinfo_map;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  discoveredDrivers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  string loaderLibraryPath;
  string loaderLibraryPathEnv;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar3 = 0;
  if (this->driverEnvironmentQueried == false) {
    bVar2 = getenv_tobool("ZE_ENABLE_LOADER_DEBUG_TRACE");
    this->debugTraceEnabled = bVar2;
    discoverEnabledDrivers_abi_cxx11_();
    loadLibraryErrorValue._M_dataplus._M_p = (pointer)&loadLibraryErrorValue.field_2;
    loadLibraryErrorValue._M_string_length = 0;
    loadLibraryErrorValue.field_2._M_local_buf[0] = '\0';
    createLogger();
    local_4b0 = &this->zel_logger;
    std::__shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_4b0->super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2> *)&message);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&message._M_string_length);
    getenv_string_abi_cxx11_(&message,"ZEL_LOADER_LOGGING_LEVEL");
    bVar2 = std::operator==(&message,"trace");
    if (bVar2) {
      bVar2 = this->debugTraceEnabled;
      std::__cxx11::string::~string((string *)&message);
      peVar8 = (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (bVar2 == false) {
        this->debugTraceEnabled = true;
        peVar8->log_to_console = false;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&message);
      peVar8 = (local_4b0->super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    if (peVar8->logging_enabled == true) {
      std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)&message,
                 &(peVar8->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>);
      loaderLibraryPath._M_dataplus._M_p._0_4_ = 1;
      loaderLibraryPathEnv._M_dataplus._M_p._0_4_ = 0x16;
      tracingLayerLibraryPath._M_dataplus._M_p._0_4_ = 0;
      fmt.str_.size_ = 0x1a;
      fmt.str_.data_ = "Loader Version {}.{}.{} {}";
      spdlog::logger::info<int,int,int,char_const(&)[41]>
                ((logger *)message._M_dataplus._M_p,fmt,(int *)&loaderLibraryPath,
                 (int *)&loaderLibraryPathEnv,(int *)&tracingLayerLibraryPath,
                 (char (*) [41])"c1872469737f807abc0ab8c4b35a263a568a6504");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&message._M_string_length);
    }
    add_loader_version(this);
    loaderLibraryPath._M_dataplus._M_p = (pointer)&loaderLibraryPath.field_2;
    loaderLibraryPath._M_string_length = 0;
    loaderLibraryPath.field_2._M_local_buf[0] = '\0';
    getenv_string_abi_cxx11_(&loaderLibraryPathEnv,"ZEL_LIBRARY_PATH");
    if (loaderLibraryPathEnv._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&loaderLibraryPath);
    }
    if (this->debugTraceEnabled == true) {
      std::__cxx11::string::string
                ((string *)&local_d0,"Using Loader Library Path: ",(allocator *)&message);
      std::__cxx11::string::string((string *)&local_f0,(string *)&loaderLibraryPath);
      debug_trace_message(this,&local_d0,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    __result = &this->zeDrivers;
    lVar7 = (long)discoveredDrivers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)discoveredDrivers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    bVar2 = getenv_tobool("ZE_ENABLE_NULL_DRIVER");
    std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::reserve
              (__result,(ulong)bVar2 + (lVar7 >> 5));
    lVar7 = (long)discoveredDrivers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)discoveredDrivers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    bVar2 = getenv_tobool("ZE_ENABLE_NULL_DRIVER");
    std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::reserve
              (&this->zesDrivers,(ulong)bVar2 + (lVar7 >> 5));
    this_00 = &this->allDrivers;
    lVar7 = (long)discoveredDrivers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)discoveredDrivers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    bVar2 = getenv_tobool("ZE_ENABLE_NULL_DRIVER");
    std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::reserve
              (this_00,(ulong)bVar2 + (lVar7 >> 5));
    bVar2 = getenv_tobool("ZE_ENABLE_NULL_DRIVER");
    if (bVar2) {
      pLVar1 = (local_4b0->super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::string
                ((string *)&local_110,"Enabling Null Driver",(allocator *)&message);
      Logger::log_info(pLVar1,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      create_library_path_abi_cxx11_(&message,"libze_null.so.1",loaderLibraryPath._M_dataplus._M_p);
      pvVar4 = (void *)dlopen(message._M_dataplus._M_p,1);
      std::__cxx11::string::~string((string *)&message);
      if (this->debugTraceEnabled == true) {
        std::__cxx11::string::string
                  ((string *)&message,"ze_null Driver Init",(allocator *)&tracingLayerLibraryPath);
        std::__cxx11::string::string((string *)&local_130,(string *)&message);
        std::__cxx11::string::string((string *)&local_150,"",(allocator *)&tracingLayerLibraryPath);
        debug_trace_message(this,&local_130,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&message);
      }
      if (pvVar4 == (void *)0x0) {
        if (this->debugTraceEnabled == true) {
          dlerror();
          std::__cxx11::string::assign((char *)&loadLibraryErrorValue);
          create_library_path_abi_cxx11_
                    (&local_418,"libze_null.so.1",loaderLibraryPath._M_dataplus._M_p);
          std::operator+(&tracingLayerLibraryPath,"Load Library of ",&local_418);
          std::operator+(&message,&tracingLayerLibraryPath," failed with ");
          std::__cxx11::string::~string((string *)&tracingLayerLibraryPath);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::string((string *)&local_170,(string *)&message);
          std::__cxx11::string::string((string *)&local_190,(string *)&loadLibraryErrorValue);
          debug_trace_message(this,&local_170,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_170);
          loadLibraryErrorValue._M_string_length = 0;
          *loadLibraryErrorValue._M_dataplus._M_p = '\0';
          std::__cxx11::string::~string((string *)&message);
        }
      }
      else {
        std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::emplace_back<>(this_00);
        (this->allDrivers).super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].handle = pvVar4;
        std::__cxx11::string::assign
                  ((char *)&(this->allDrivers).
                            super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1].name);
      }
    }
    for (pbVar9 = discoveredDrivers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar9 != discoveredDrivers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
      std::__cxx11::string::string((string *)&message,(string *)pbVar9);
      pvVar4 = (void *)dlopen(message._M_dataplus._M_p,1);
      if (pvVar4 == (void *)0x0) {
        if (this->debugTraceEnabled != false) {
          dlerror();
          std::__cxx11::string::assign((char *)&loadLibraryErrorValue);
          std::operator+(&local_418,"Load Library of ",&message);
          std::operator+(&tracingLayerLibraryPath,&local_418," failed with ");
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::string((string *)&local_70,(string *)&tracingLayerLibraryPath);
          std::__cxx11::string::string((string *)&local_90,(string *)&loadLibraryErrorValue);
          debug_trace_message(this,&local_70,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_70);
          loadLibraryErrorValue._M_string_length = 0;
          *loadLibraryErrorValue._M_dataplus._M_p = '\0';
          std::__cxx11::string::~string((string *)&tracingLayerLibraryPath);
        }
      }
      else {
        if (this->debugTraceEnabled != false) {
          std::operator+(&local_418,"Loading Driver ",&message);
          std::operator+(&tracingLayerLibraryPath,&local_418," succeeded");
          std::__cxx11::string::~string((string *)&local_418);
          iVar3 = dlinfo(pvVar4,2,&dlinfo_map);
          if (iVar3 == 0) {
            std::__cxx11::string::string((string *)&local_3c8,dlinfo_map->l_name,&local_4b1);
            std::operator+(&local_418," from: ",&local_3c8);
            std::__cxx11::string::append((string *)&tracingLayerLibraryPath);
            std::__cxx11::string::~string((string *)&local_418);
            std::__cxx11::string::~string((string *)&local_3c8);
          }
          std::__cxx11::string::string((string *)&local_b0,(string *)&tracingLayerLibraryPath);
          std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_418);
          debug_trace_message(this,&local_b0,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&tracingLayerLibraryPath);
        }
        std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::emplace_back<>(this_00);
        (this->allDrivers).super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].handle = pvVar4;
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(this->allDrivers).
                    super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].name);
      }
      std::__cxx11::string::~string((string *)&message);
    }
    __first = (this->allDrivers).
              super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    __last = (this->allDrivers).
             super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__last == __first) {
      if (this->debugTraceEnabled == true) {
        std::__cxx11::string::string
                  ((string *)&message,"0 Drivers Discovered",(allocator *)&tracingLayerLibraryPath);
        std::__cxx11::string::string((string *)&local_1b0,(string *)&message);
        std::__cxx11::string::string((string *)&local_1d0,"",(allocator *)&tracingLayerLibraryPath);
        debug_trace_message(this,&local_1b0,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&message);
      }
      pLVar1 = (local_4b0->super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::string
                ((string *)&local_1f0,"0 Drivers Discovered",(allocator *)&message);
      Logger::log_error(pLVar1,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      iVar3 = 0x78000001;
    }
    else {
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<loader::driver_t*,std::back_insert_iterator<std::vector<loader::driver_t,std::allocator<loader::driver_t>>>>
                (__first,__last,
                 (back_insert_iterator<std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                  )__result);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<loader::driver_t*,std::back_insert_iterator<std::vector<loader::driver_t,std::allocator<loader::driver_t>>>>
                ((this->allDrivers).
                 super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (this->allDrivers).
                 super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (back_insert_iterator<std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                  )&this->zesDrivers);
      bVar2 = getenv_tobool("ZE_ENABLE_VALIDATION_LAYER");
      if (bVar2) {
        pLVar1 = (local_4b0->super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::string
                  ((string *)&local_210,"Validation Layer Enabled",(allocator *)&message);
        Logger::log_info(pLVar1,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        create_library_path_abi_cxx11_
                  (&tracingLayerLibraryPath,"libze_validation_layer.so.1",
                   loaderLibraryPath._M_dataplus._M_p);
        pvVar4 = (void *)dlopen(CONCAT44(tracingLayerLibraryPath._M_dataplus._M_p._4_4_,
                                         tracingLayerLibraryPath._M_dataplus._M_p._0_4_),1);
        this->validationLayer = pvVar4;
        if (pvVar4 == (void *)0x0) {
          if (this->debugTraceEnabled == true) {
            dlerror();
            std::__cxx11::string::assign((char *)&loadLibraryErrorValue);
            std::__cxx11::string::string
                      ((string *)&local_3c8,"libze_validation_layer.so.1",(allocator *)&dlinfo_map);
            std::operator+(&local_418,"Load Library of ",&local_3c8);
            std::operator+(&message,&local_418," failed with ");
            std::__cxx11::string::~string((string *)&local_418);
            std::__cxx11::string::~string((string *)&local_3c8);
            std::__cxx11::string::string((string *)&local_230,(string *)&message);
            std::__cxx11::string::string((string *)&local_250,(string *)&loadLibraryErrorValue);
            debug_trace_message(this,&local_230,&local_250);
            std::__cxx11::string::~string((string *)&local_250);
            std::__cxx11::string::~string((string *)&local_230);
            loadLibraryErrorValue._M_string_length = 0;
            *loadLibraryErrorValue._M_dataplus._M_p = '\0';
            std::__cxx11::string::~string((string *)&message);
          }
        }
        else {
          pcVar5 = (code *)dlsym(pvVar4,"zelLoaderGetVersion");
          if (pcVar5 != (code *)0x0) {
            iVar3 = (*pcVar5)(&message);
            if (iVar3 == 0) {
              std::vector<zel_component_version,_std::allocator<zel_component_version>_>::push_back
                        (&this->compVersions,(value_type *)&message);
            }
          }
        }
        std::__cxx11::string::~string((string *)&tracingLayerLibraryPath);
      }
      bVar2 = getenv_tobool("ZE_ENABLE_TRACING_LAYER");
      if (bVar2) {
        pLVar1 = (local_4b0->super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::string
                  ((string *)&local_270,"Tracing Layer Enabled",(allocator *)&message);
        Logger::log_info(pLVar1,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        this->tracingLayerEnabled = true;
      }
      create_library_path_abi_cxx11_
                (&tracingLayerLibraryPath,"libze_tracing_layer.so.1",
                 loaderLibraryPath._M_dataplus._M_p);
      if (this->debugTraceEnabled == true) {
        std::__cxx11::string::string
                  ((string *)&local_290,"Tracing Layer Library Path: ",(allocator *)&message);
        std::__cxx11::string::string((string *)&local_2b0,(string *)&tracingLayerLibraryPath);
        debug_trace_message(this,&local_290,&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_290);
      }
      pvVar4 = (void *)dlopen(CONCAT44(tracingLayerLibraryPath._M_dataplus._M_p._4_4_,
                                       tracingLayerLibraryPath._M_dataplus._M_p._0_4_),1);
      this->tracingLayer = pvVar4;
      if (pvVar4 == (void *)0x0) {
        if (this->debugTraceEnabled == true) {
          dlerror();
          std::__cxx11::string::assign((char *)&loadLibraryErrorValue);
          std::__cxx11::string::string
                    ((string *)&local_3c8,"libze_tracing_layer.so.1",(allocator *)&dlinfo_map);
          std::operator+(&local_418,"Load Library of ",&local_3c8);
          std::operator+(&message,&local_418," failed with ");
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::string((string *)&local_2d0,(string *)&message);
          std::__cxx11::string::string((string *)&local_2f0,(string *)&loadLibraryErrorValue);
          debug_trace_message(this,&local_2d0,&local_2f0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_2d0);
          loadLibraryErrorValue._M_string_length = 0;
          *loadLibraryErrorValue._M_dataplus._M_p = '\0';
          std::__cxx11::string::~string((string *)&message);
        }
      }
      else {
        pcVar5 = (code *)dlsym(pvVar4,"zelLoaderGetVersion");
        if (pcVar5 != (code *)0x0) {
          iVar3 = (*pcVar5)(&message);
          if (iVar3 == 0) {
            std::vector<zel_component_version,_std::allocator<zel_component_version>_>::push_back
                      (&this->compVersions,(value_type *)&message);
          }
        }
      }
      bVar2 = getenv_tobool("ZET_ENABLE_API_TRACING_EXP");
      if (bVar2) {
        pLVar1 = (local_4b0->super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::string
                  ((string *)&local_310,
                   "ZET_ENABLE_API_TRACING_EXP is deprecated. Use ZE_ENABLE_TRACING_LAYER instead",
                   (allocator *)&message);
        Logger::log_warning(pLVar1,&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "ZET_ENABLE_API_TRACING_EXP is deprecated. Use ZE_ENABLE_TRACING_LAYER instead"
                                );
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      bVar2 = getenv_tobool("ZE_ENABLE_LOADER_INTERCEPT");
      this->forceIntercept = bVar2;
      this->sysmanInstanceDrivers = __result;
      if ((bVar2) ||
         (1 < (ulong)(((long)(this->allDrivers).
                             super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->allDrivers).
                            super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0xd98))) {
        this->intercept_enabled = true;
        pLVar1 = (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__cxx11::string::string((string *)&local_330,"Intercept Enabled",(allocator *)&message)
        ;
        Logger::log_info(pLVar1,&local_330);
        std::__cxx11::string::~string((string *)&local_330);
      }
      this->driverEnvironmentQueried = true;
      pLVar1 = (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      std::__cxx11::string::string((string *)&local_350,"zeInit succeeded",(allocator *)&message);
      Logger::log_info(pLVar1,&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&tracingLayerLibraryPath);
      iVar3 = 0;
    }
    std::__cxx11::string::~string((string *)&loaderLibraryPathEnv);
    std::__cxx11::string::~string((string *)&loaderLibraryPath);
    std::__cxx11::string::~string((string *)&loadLibraryErrorValue);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&discoveredDrivers);
  }
  return iVar3;
}

Assistant:

ze_result_t context_t::init()
    {
        if (driverEnvironmentQueried) {
            return ZE_RESULT_SUCCESS;
        }
        debugTraceEnabled = getenv_tobool( "ZE_ENABLE_LOADER_DEBUG_TRACE" );
        auto discoveredDrivers = discoverEnabledDrivers();
        std::string loadLibraryErrorValue;

        zel_logger = createLogger();

        if ((getenv_string("ZEL_LOADER_LOGGING_LEVEL") == "trace") && !debugTraceEnabled) {
            debugTraceEnabled = true;
            zel_logger->log_to_console = false;
        }

        if (zel_logger->logging_enabled)
            zel_logger->get_base_logger()->info("Loader Version {}.{}.{} {}", LOADER_VERSION_MAJOR, LOADER_VERSION_MINOR, LOADER_VERSION_PATCH, LOADER_VERSION_SHA);

        add_loader_version();
        std::string loaderLibraryPath;
        auto loaderLibraryPathEnv = getenv_string("ZEL_LIBRARY_PATH");
        if (!loaderLibraryPathEnv.empty()) {
            loaderLibraryPath = loaderLibraryPathEnv;
        }
#ifdef _WIN32
        else {
            loaderLibraryPath = readLevelZeroLoaderLibraryPath();
        }
#endif
        if (debugTraceEnabled)
            debug_trace_message("Using Loader Library Path: ", loaderLibraryPath);

        // To allow for two different sets of drivers to be in use between sysman and core/tools, we use and store the drivers in two vectors.
        // alldrivers stores all the drivers for cleanup when the library exits.
        zeDrivers.reserve( discoveredDrivers.size() + getenv_tobool( "ZE_ENABLE_NULL_DRIVER" ) );
        zesDrivers.reserve( discoveredDrivers.size() + getenv_tobool( "ZE_ENABLE_NULL_DRIVER" ) );
        allDrivers.reserve( discoveredDrivers.size() + getenv_tobool( "ZE_ENABLE_NULL_DRIVER" ) );
        if( getenv_tobool( "ZE_ENABLE_NULL_DRIVER" ) )
        {
            zel_logger->log_info("Enabling Null Driver");
            auto handle = LOAD_DRIVER_LIBRARY( create_library_path( MAKE_LIBRARY_NAME( "ze_null", L0_LOADER_VERSION ), loaderLibraryPath.c_str()).c_str());
            if (debugTraceEnabled) {
                std::string message = "ze_null Driver Init";
                debug_trace_message(message, "");
            }
            if( NULL != handle )
            {
                allDrivers.emplace_back();
                allDrivers.rbegin()->handle = handle;
                allDrivers.rbegin()->name = "ze_null";
            } else if (debugTraceEnabled) {
                GET_LIBRARY_ERROR(loadLibraryErrorValue);
                std::string errorMessage = "Load Library of " + create_library_path( MAKE_LIBRARY_NAME( "ze_null", L0_LOADER_VERSION ), loaderLibraryPath.c_str()) + " failed with ";
                debug_trace_message(errorMessage, loadLibraryErrorValue);
                loadLibraryErrorValue.clear();
            }
        }

        for( auto name : discoveredDrivers )
        {
            auto handle = LOAD_DRIVER_LIBRARY( name.c_str() );
            if( NULL != handle )
            {
                if (debugTraceEnabled) {
                    std::string message = "Loading Driver " + name + " succeeded";
#if !defined(_WIN32) && !defined(ANDROID)
                    // TODO: implement same message for windows, move dlinfo to ze_util.h as a macro
                    struct link_map *dlinfo_map;
                    if (dlinfo(handle, RTLD_DI_LINKMAP, &dlinfo_map) == 0) {
                        message += " from: " + std::string(dlinfo_map->l_name);
                    }
#endif
                    debug_trace_message(message, "");
                }
                allDrivers.emplace_back();
                allDrivers.rbegin()->handle = handle;
                allDrivers.rbegin()->name = name;
            } else if (debugTraceEnabled) {
                GET_LIBRARY_ERROR(loadLibraryErrorValue);
                std::string errorMessage = "Load Library of " + name + " failed with ";
                debug_trace_message(errorMessage, loadLibraryErrorValue);
                loadLibraryErrorValue.clear();
            }
        }
        if(allDrivers.size()==0){
            if (debugTraceEnabled) {
                std::string message = "0 Drivers Discovered";
                debug_trace_message(message, "");
            }
            zel_logger->log_error("0 Drivers Discovered");
            return ZE_RESULT_ERROR_UNINITIALIZED;
        }
        std::copy(allDrivers.begin(), allDrivers.end(), std::back_inserter(zeDrivers));
        std::copy(allDrivers.begin(), allDrivers.end(), std::back_inserter(zesDrivers));

        typedef ze_result_t (ZE_APICALL *getVersion_t)(zel_component_version_t *version);
        if( getenv_tobool( "ZE_ENABLE_VALIDATION_LAYER" ) )
        {
            zel_logger->log_info("Validation Layer Enabled");
            std::string validationLayerLibraryPath = create_library_path(MAKE_LAYER_NAME( "ze_validation_layer" ), loaderLibraryPath.c_str());
            validationLayer = LOAD_DRIVER_LIBRARY( validationLayerLibraryPath.c_str() );
            if(validationLayer)
            {
                auto getVersion = reinterpret_cast<getVersion_t>(
                    GET_FUNCTION_PTR(validationLayer, "zelLoaderGetVersion"));
                zel_component_version_t compVersion;
                if(getVersion && ZE_RESULT_SUCCESS == getVersion(&compVersion))
                {   
                    compVersions.push_back(compVersion);
                }
            } else if (debugTraceEnabled) {
                GET_LIBRARY_ERROR(loadLibraryErrorValue);
                std::string errorMessage = "Load Library of " + std::string(MAKE_LAYER_NAME( "ze_validation_layer" )) + " failed with ";
                debug_trace_message(errorMessage, loadLibraryErrorValue);
                loadLibraryErrorValue.clear();
            }
        }

        if (getenv_tobool( "ZE_ENABLE_TRACING_LAYER" )) {
            zel_logger->log_info("Tracing Layer Enabled");
            tracingLayerEnabled = true;
        }
        std::string tracingLayerLibraryPath = create_library_path(MAKE_LAYER_NAME( "ze_tracing_layer" ), loaderLibraryPath.c_str());
        if (debugTraceEnabled)
            debug_trace_message("Tracing Layer Library Path: ", tracingLayerLibraryPath);
        tracingLayer = LOAD_DRIVER_LIBRARY( tracingLayerLibraryPath.c_str() );
        if(tracingLayer)
        {
            auto getVersion = reinterpret_cast<getVersion_t>(
                GET_FUNCTION_PTR(tracingLayer, "zelLoaderGetVersion"));
            zel_component_version_t compVersion;
            if(getVersion && ZE_RESULT_SUCCESS == getVersion(&compVersion))
            {   
                compVersions.push_back(compVersion);
            }
        } else if (debugTraceEnabled) {
            GET_LIBRARY_ERROR(loadLibraryErrorValue);
            std::string errorMessage = "Load Library of " + std::string(MAKE_LAYER_NAME( "ze_tracing_layer" )) + " failed with ";
            debug_trace_message(errorMessage, loadLibraryErrorValue);
            loadLibraryErrorValue.clear();
        }

        if( getenv_tobool( "ZET_ENABLE_API_TRACING_EXP" ) ) {
            auto depr_msg = "ZET_ENABLE_API_TRACING_EXP is deprecated. Use ZE_ENABLE_TRACING_LAYER instead";
            zel_logger->log_warning(depr_msg);
            std::cout << depr_msg << std::endl;
        }

        forceIntercept = getenv_tobool( "ZE_ENABLE_LOADER_INTERCEPT" );

        // Default sysmanInstance Drivers to be the zeDrivers list unless zesInit is called during init.
        sysmanInstanceDrivers = &zeDrivers;

        if(forceIntercept || allDrivers.size() > 1){
             intercept_enabled = true;
             zel_logger->log_info("Intercept Enabled");
        }

        driverEnvironmentQueried = true;

        zel_logger->log_info("zeInit succeeded");
        return ZE_RESULT_SUCCESS;
    }